

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O3

void __thiscall QStatusBar::paintEvent(QStatusBar *this,QPaintEvent *event)

{
  QStatusBarPrivate *this_00;
  long lVar1;
  long lVar2;
  SBItem *pSVar3;
  long lVar4;
  char cVar5;
  QStyle *pQVar6;
  QPalette *pQVar7;
  undefined8 uVar8;
  long lVar9;
  undefined8 uVar10;
  long in_FS_OFFSET;
  QPainter p;
  QStyleOption opt_1;
  QStyleOption opt;
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 auStack_90 [16];
  QObject *pQStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QStatusBarPrivate **)&(this->super_QWidget).field_0x8;
  lVar1 = (this_00->tempItem).d.size;
  local_c0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)local_c0,&(this->super_QWidget).super_QPaintDevice);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)&local_78,1,0);
  QStyleOption::initFrom((QStyleOption *)&local_78,&this->super_QWidget);
  pQVar6 = QWidget::style(&this->super_QWidget);
  (**(code **)(*(long *)pQVar6 + 0xb0))
            (pQVar6,0x2e,(QStyleOption *)&local_78,(QPainter *)local_c0,this);
  lVar2 = (this_00->items).d.size;
  if (lVar2 != 0) {
    pSVar3 = (this_00->items).d.ptr;
    lVar9 = 0;
    do {
      lVar4 = *(long *)(*(long *)((long)&pSVar3->widget + lVar9) + 0x20);
      if (((*(byte *)(lVar4 + 9) & 0x80) != 0) &&
         ((lVar1 == 0 || (*(int *)((long)&pSVar3->category + lVar9) == 1)))) {
        uVar8._0_4_ = *(int *)(lVar4 + 0x14) + -2;
        uVar10._0_4_ = *(int *)(lVar4 + 0x1c) + 2;
        uVar8._4_4_ = *(int *)(lVar4 + 0x18) + -1;
        uVar10._4_4_ = *(int *)(lVar4 + 0x20) + 1;
        cVar5 = QRect::intersects((QRect *)(event + 0x10));
        if (cVar5 != '\0') {
          auStack_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_80 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          auStack_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
          local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QStyleOption::QStyleOption((QStyleOption *)local_b8,0,0);
          local_a8 = (undefined1 *)uVar8;
          puStack_a0 = (undefined1 *)uVar10;
          pQVar7 = QWidget::palette(&this->super_QWidget);
          QPalette::operator=((QPalette *)auStack_90,pQVar7);
          local_b8._8_4_ = 0;
          pQVar6 = QWidget::style(&this->super_QWidget);
          (**(code **)(*(long *)pQVar6 + 0xb0))
                    (pQVar6,7,(QStyleOption *)local_b8,local_c0,
                     *(undefined8 *)((long)&pSVar3->widget + lVar9));
          QStyleOption::~QStyleOption((QStyleOption *)local_b8);
        }
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar2 << 4 != lVar9);
  }
  if (lVar1 != 0) {
    pQVar7 = QWidget::palette(&this->super_QWidget);
    QPalette::brush((ColorGroup)pQVar7,Dark);
    QPainter::setPen((QColor *)local_c0);
    local_b8 = (undefined1  [16])QStatusBarPrivate::messageRect(this_00);
    QPainter::drawText((QRect *)local_c0,(int)local_b8,(QString *)0x181,(QRect *)&this_00->tempItem)
    ;
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_78);
  QPainter::~QPainter((QPainter *)local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStatusBar::paintEvent(QPaintEvent *event)
{
    Q_D(QStatusBar);
    bool haveMessage = !d->tempItem.isEmpty();

    QPainter p(this);
    QStyleOption opt;
    opt.initFrom(this);
    style()->drawPrimitive(QStyle::PE_PanelStatusBar, &opt, &p, this);

    for (const auto &item : std::as_const(d->items)) {
        if (item.widget->isVisible() && (!haveMessage || item.isPermanent())) {
            QRect ir = item.widget->geometry().adjusted(-2, -1, 2, 1);
            if (event->rect().intersects(ir)) {
                QStyleOption opt(0);
                opt.rect = ir;
                opt.palette = palette();
                opt.state = QStyle::State_None;
                style()->drawPrimitive(QStyle::PE_FrameStatusBarItem, &opt, &p, item.widget);
            }
        }
    }
    if (haveMessage) {
        p.setPen(palette().windowText().color());
        p.drawText(d->messageRect(), Qt::AlignLeading | Qt::AlignVCenter | Qt::TextSingleLine, d->tempItem);
    }
}